

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O3

void __thiscall
Js::SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true>::EnsureSlotCapacity
          (SimpleDictionaryTypeHandlerBase<int,_Js::JavascriptString_*,_true> *this,
          DynamicObject *instance)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 *puVar5;
  
  if (0x3ffffffe < (this->super_DynamicTypeHandler).slotCapacity) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x9fd,"(this->GetSlotCapacity() < MaxPropertyIndexSize)",
                                "this->GetSlotCapacity() < MaxPropertyIndexSize");
    if (!bVar2) goto LAB_00e1da4e;
    *puVar5 = 0;
  }
  iVar3 = ::Math::Add<int>(this->nextPropertyIndex,1);
  iVar4 = ::Math::Add<int>(iVar3,iVar3 >> 2);
  iVar3 = 0x3fffffff;
  if (iVar4 < 0x3fffffff) {
    iVar3 = iVar4;
  }
  iVar3 = DynamicTypeHandler::RoundUpSlotCapacity
                    (iVar3,(this->super_DynamicTypeHandler).inlineSlotCapacity);
  if (0x3fffffff < iVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0xa0c,"(newSlotCapacity <= MaxPropertyIndexSize)",
                                "newSlotCapacity <= MaxPropertyIndexSize");
    if (!bVar2) {
LAB_00e1da4e:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  DynamicObject::EnsureSlots
            (instance,(this->super_DynamicTypeHandler).slotCapacity,iVar3,
             (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr,&this->super_DynamicTypeHandler);
  (this->super_DynamicTypeHandler).slotCapacity = iVar3;
  return;
}

Assistant:

void SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::EnsureSlotCapacity(DynamicObject * instance)
    {
        Assert(this->GetSlotCapacity() < MaxPropertyIndexSize); // Otherwise we can't grow this handler's capacity. We should've evolved to bigger handler or OOM.

        // This check should be done by caller of this function.
        //if (slotCapacity <= nextPropertyIndex)
        {
            // A Dictionary type is expected to have more properties
            // grow exponentially rather linearly to avoid the realloc and moves,
            // however use a small exponent to avoid waste
            int newSlotCapacity = ::Math::Add(nextPropertyIndex, (TPropertyIndex)1);
            newSlotCapacity = ::Math::Add(newSlotCapacity, newSlotCapacity >> 2);
            if (newSlotCapacity > MaxPropertyIndexSize)
            {
                newSlotCapacity = MaxPropertyIndexSize;
            }
            newSlotCapacity = RoundUpSlotCapacity(newSlotCapacity, GetInlineSlotCapacity());
            Assert(newSlotCapacity <= MaxPropertyIndexSize);

            instance->EnsureSlots(this->GetSlotCapacity(), newSlotCapacity, instance->GetScriptContext(), this);
            this->SetSlotCapacity(newSlotCapacity);
        }
    }